

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_tables_only(j_compress_ptr cinfo)

{
  long in_RDI;
  j_compress_ptr unaff_retaddr;
  int i;
  JPEG_MARKER in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar1;
  
  emit_marker((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              in_stack_ffffffffffffffec);
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    if (*(long *)(in_RDI + 0x70 + (long)iVar1 * 8) != 0) {
      emit_dqt(cinfo,i);
    }
  }
  if (*(int *)(in_RDI + 0x124) == 0) {
    for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
      if (*(long *)(in_RDI + 0xa0 + (long)iVar1 * 8) != 0) {
        emit_dht(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(boolean)in_RDI);
      }
      if (*(long *)(in_RDI + 0xc0 + (long)iVar1 * 8) != 0) {
        emit_dht(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(boolean)in_RDI);
      }
    }
  }
  emit_marker((j_compress_ptr)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

METHODDEF(void)
write_tables_only (j_compress_ptr cinfo)
{
  int i;

  emit_marker(cinfo, M_SOI);

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if (cinfo->quant_tbl_ptrs[i] != NULL)
      (void) emit_dqt(cinfo, i);
  }

  if (! cinfo->arith_code) {
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      if (cinfo->dc_huff_tbl_ptrs[i] != NULL)
	emit_dht(cinfo, i, FALSE);
      if (cinfo->ac_huff_tbl_ptrs[i] != NULL)
	emit_dht(cinfo, i, TRUE);
    }
  }

  emit_marker(cinfo, M_EOI);
}